

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var Js::InterpreterStackFrame::InterpreterHelper
              (ScriptFunction *function,ArgumentReader *args,void *returnAddress,
              void *addressOfReturnAddress,AsmJsReturnStruct *asmJsReturn)

{
  ulong uVar1;
  byte bVar2;
  uint8 uVar3;
  ImplicitCallFlags flags;
  ushort uVar4;
  uint uVar5;
  ScriptContext *this;
  ThreadContext *this_00;
  Utf8SourceInfo *pUVar6;
  ThreadContext *pTVar7;
  Type *pTVar8;
  code *pcVar9;
  long lVar10;
  Type TVar11;
  bool bVar12;
  bool bVar13;
  BOOL BVar14;
  uint32 uVar15;
  RegSlot RVar16;
  int *piVar17;
  undefined4 *puVar18;
  FunctionBody *this_01;
  FunctionInfo *pFVar19;
  void *pvVar20;
  LoopHeader *loopHeaderArray;
  undefined1 this_02 [8];
  Var pvVar21;
  ExecutionInfoManager *pEVar22;
  int64 *piVar23;
  ulong uVar24;
  ExecutionInfoManager *pEVar25;
  Var *ppvVar26;
  PVOID unaff_retaddr;
  undefined1 *puStack_f0;
  undefined1 auStack_e8 [16];
  ArenaAllocator *tmpAlloc;
  Setup setup;
  DynamicProfileInfo *local_88;
  undefined1 auStack_78 [8];
  TTDExceptionFramePopper exceptionFramePopper;
  
  piVar23 = (int64 *)auStack_e8;
  pEVar22 = (ExecutionInfoManager *)auStack_e8;
  puStack_f0 = (undefined1 *)0x975996;
  piVar17 = (int *)__tls_get_addr(&PTR_01548d20);
  *piVar17 = *piVar17 + 1;
  puStack_f0 = (undefined1 *)0x9759b0;
  bVar12 = ConfigFlagsTable::IsEnabled
                     ((ConfigFlagsTable *)&Configuration::Global,
                      InjectPartiallyInitializedInterpreterFrameErrorFlag);
  setup._56_8_ = addressOfReturnAddress;
  if ((bVar12) && (DAT_0159efc8 == *piVar17)) {
    if ((DAT_0159efcc != 0) && (DAT_0159efcc == 1)) {
      puStack_f0 = (undefined1 *)0x976385;
      JavascriptError::MapAndThrowError
                ((((((function->super_ScriptFunctionBase).super_JavascriptFunction.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ffcd);
    }
LAB_00976385:
    pcVar9 = (code *)invalidInstructionException();
    (*pcVar9)();
  }
  this = (((((function->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
  this_00 = this->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitExceptionFlag) != DisableImplicitNoFlag) {
    AssertCount = AssertCount + 1;
    puStack_f0 = (undefined1 *)0x975a15;
    Throw::LogAssert();
    puStack_f0 = (undefined1 *)0x975a25;
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    puStack_f0 = (undefined1 *)0x975a4d;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x791,"(!threadContext->IsDisableImplicitException())",
                                 "!threadContext->IsDisableImplicitException()");
    if (!bVar12) goto LAB_00976385;
    *puVar18 = 0;
  }
  puStack_f0 = (undefined1 *)0x975a64;
  BVar14 = RecyclableObject::IsExternal((RecyclableObject *)function);
  puStack_f0 = (undefined1 *)0x975a76;
  ScriptContext::VerifyAlive(this,(uint)(BVar14 == 0),(ScriptContext *)0x0);
  if (this_00->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    puStack_f0 = (undefined1 *)0x975a91;
    Throw::LogAssert();
    puStack_f0 = (undefined1 *)0x975aa1;
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    puStack_f0 = (undefined1 *)0x975ac9;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x793,"(threadContext->IsScriptActive())",
                                 "threadContext->IsScriptActive()");
    if (!bVar12) goto LAB_00976385;
    *puVar18 = 0;
  }
  if (this_00->callRootLevel == 0) {
    AssertCount = AssertCount + 1;
    puStack_f0 = (undefined1 *)0x975af2;
    Throw::LogAssert();
    puStack_f0 = (undefined1 *)0x975b02;
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    puStack_f0 = (undefined1 *)0x975b2a;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x794,"(threadContext->IsInScript())",
                                 "threadContext->IsInScript()");
    if (!bVar12) goto LAB_00976385;
    *puVar18 = 0;
  }
  puStack_f0 = (undefined1 *)0x975b41;
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  if (asmJsReturn == (AsmJsReturnStruct *)0x0) {
    pUVar6 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    bVar2 = pUVar6->field_0xa8;
    if ((pUVar6->debugModeSource).ptr == (uchar *)0x0 && (bVar2 & 0x20) == 0) {
      bVar12 = false;
    }
    else {
      bVar12 = (bool)((bVar2 & 0x40) >> 6);
    }
    puStack_f0 = (undefined1 *)0x975b85;
    bVar13 = ScriptContext::IsScriptContextInDebugMode(this);
    if (bVar12 != bVar13) {
      pUVar6 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
      bVar2 = pUVar6->field_0xa8;
      if ((bVar2 & 4) == 0) {
        puStack_f0 = &LAB_00976391;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      if (((bVar2 & 0x40) != 0) &&
         ((bVar2 & 0x20) != 0 || (pUVar6->debugModeSource).ptr != (uchar *)0x0)) {
        AssertCount = AssertCount + 1;
        puStack_f0 = (undefined1 *)0x975bc2;
        Throw::LogAssert();
        puStack_f0 = (undefined1 *)0x975bd2;
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar18 = 1;
        puStack_f0 = (undefined1 *)0x975bfa;
        bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                     ,0x79c,"(!executeFunction->IsInDebugMode())",
                                     "!executeFunction->IsInDebugMode()");
        if (!bVar12) goto LAB_00976385;
        *puVar18 = 0;
      }
    }
  }
  puStack_f0 = (undefined1 *)0x975c11;
  uVar15 = FunctionBody::GetInterpretedCount(this_01);
  if (uVar15 == 0) {
    puStack_f0 = (undefined1 *)0x975c1d;
    FunctionBody::TraceInterpreterExecutionMode(this_01);
  }
  uVar3 = this_00->loopDepth;
  if ((uVar3 != '\0') &&
     (((this_01->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 4) == 0)) {
    puStack_f0 = (undefined1 *)0x975c3c;
    FunctionBody::SetWasCalledFromLoop(this_01);
  }
  puStack_f0 = (undefined1 *)0x975c44;
  bVar12 = ShouldDoProfile(this_01);
  if (bVar12) {
    puStack_f0 = (undefined1 *)0x975c55;
    local_88 = FunctionBody::GetDynamicProfileInfo(this_01);
    puStack_f0 = (undefined1 *)0x975c62;
    ThreadContext::ClearImplicitCallFlags(this_00);
  }
  else {
    local_88 = (DynamicProfileInfo *)0x0;
  }
  puStack_f0 = (undefined1 *)0x975c74;
  FunctionBody::IncreaseInterpretedCount(this_01);
  this->interpretedCount = this->interpretedCount + 1;
  puStack_f0 = (undefined1 *)0x975c83;
  uVar15 = FunctionBody::GetInterpretedCount(this_01);
  if (uVar15 < this->maxFuncInterpret) {
    uVar15 = this->maxFuncInterpret;
  }
  this->maxFuncInterpret = uVar15;
  pFVar19 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar19 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    puStack_f0 = (undefined1 *)0x975cad;
    Throw::LogAssert();
    puStack_f0 = (undefined1 *)0x975cbd;
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    puStack_f0 = (undefined1 *)0x975ce5;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar13) goto LAB_00976385;
    *puVar18 = 0;
    pFVar19 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar19->functionBodyImpl).ptr != this_01) {
    AssertCount = AssertCount + 1;
    puStack_f0 = (undefined1 *)0x975d0c;
    Throw::LogAssert();
    puStack_f0 = (undefined1 *)0x975d1c;
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    puStack_f0 = (undefined1 *)0x975d44;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                 "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar13) goto LAB_00976385;
    *puVar18 = 0;
    pFVar19 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((pFVar19->attributes & DeferredParse) != None) {
    AssertCount = AssertCount + 1;
    puStack_f0 = (undefined1 *)0x975d6b;
    Throw::LogAssert();
    puStack_f0 = (undefined1 *)0x975d7b;
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    puStack_f0 = (undefined1 *)0x975da3;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                 ,0x7d8,"(!executeFunction->IsDeferredParseFunction())",
                                 "Non-intrinsic functions must provide byte-code to execute");
    if (!bVar13) goto LAB_00976385;
    *puVar18 = 0;
  }
  puStack_f0 = (undefined1 *)0x975dba;
  FunctionBody::BeginExecution(this_01);
  if (asmJsReturn == (AsmJsReturnStruct *)0x0) {
    pFVar19 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar19 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      puStack_f0 = (undefined1 *)0x975ed8;
      Throw::LogAssert();
      puStack_f0 = (undefined1 *)0x975ee8;
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar18 = 1;
      puStack_f0 = (undefined1 *)0x975f10;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar13) goto LAB_00976385;
      *puVar18 = 0;
      pFVar19 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar19->functionBodyImpl).ptr != this_01) {
      AssertCount = AssertCount + 1;
      puStack_f0 = (undefined1 *)0x975f37;
      Throw::LogAssert();
      puStack_f0 = (undefined1 *)0x975f47;
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar18 = 1;
      puStack_f0 = (undefined1 *)0x975f6f;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                   "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar13) goto LAB_00976385;
      *puVar18 = 0;
      pFVar19 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((pFVar19->attributes & (Async|Generator)) != None) {
      if (((ulong)(args->super_Arguments).Info & 0x8ffffff) != 2) {
        AssertCount = AssertCount + 1;
        puStack_f0 = (undefined1 *)0x975faf;
        Throw::LogAssert();
        puStack_f0 = (undefined1 *)0x975fbf;
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar18 = 1;
        puStack_f0 = (undefined1 *)0x975fe7;
        bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                     ,0x7e7,
                                     "(args.Info.Count == 2 && ((args.Info.Flags & CallFlags_ExtraArg) == CallFlags_None))"
                                     ,
                                     "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object"
                                    );
        if (!bVar13) goto LAB_00976385;
        *puVar18 = 0;
      }
      puStack_f0 = (undefined1 *)0x976001;
      pvVar21 = Arguments::operator[](&args->super_Arguments,0);
      puStack_f0 = (undefined1 *)0x976009;
      tmpAlloc = (ArenaAllocator *)VarTo<Js::JavascriptGenerator>(pvVar21);
      this_02 = (undefined1  [8])(((JavascriptGenerator *)tmpAlloc)->frame).ptr;
      if (this_02 == (undefined1  [8])0x0) {
        puStack_f0 = (undefined1 *)0x9760fe;
        this_02 = (undefined1  [8])
                  CreateInterpreterStackFrameForGenerator
                            (function,this_01,(JavascriptGenerator *)tmpAlloc,bVar12);
      }
      else {
        puStack_f0 = (undefined1 *)0x976025;
        RVar16 = FunctionBody::GetYieldRegister(this_01);
        puStack_f0 = (undefined1 *)0x976036;
        pvVar21 = Arguments::operator[](&args->super_Arguments,1);
        (&((ExecutionInfoManager *)this_02)->m_activeBPId)[RVar16] = (int64)pvVar21;
        (((ExecutionInfoManager *)this_02)->m_lastReturnLocation).m_lastFrame.
        CurrentStatementLoopTime = (uint64)&tmpAlloc;
        *(undefined4 *)&(((ExecutionInfoManager *)this_02)->m_lastExceptionLocation).m_etime = 0;
      }
      bVar13 = false;
      goto LAB_00976108;
    }
  }
  puStack_f0 = (undefined1 *)0x975de1;
  Setup::Setup((Setup *)&tmpAlloc,function,&args->super_Arguments,false,false,false);
  uVar24 = (ulong)setup.localCount;
  uVar1 = uVar24 + (uint)setup.inSlotsCount;
  if (uVar1 < 0x8001) {
    puStack_f0 = (undefined1 *)0x975e89;
    ThreadContext::ProbeStack(this->threadContext,uVar1 * 8 + 0x4000,this,unaff_retaddr);
    lVar10 = -(uVar1 * 8 + 0xf & 0xfffffffffffffff0);
    pEVar22 = (ExecutionInfoManager *)(auStack_e8 + lVar10);
    auStack_78 = (undefined1  [8])pEVar22;
    *(undefined8 *)(auStack_e8 + lVar10 + -8) = 0x975eb2;
    memset(pEVar22,0xfe,uVar1 * 8);
    ppvVar26 = (Var *)0x0;
    bVar13 = false;
    pEVar25 = pEVar22;
  }
  else {
    auStack_e8._8_8_ = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0;
    puStack_f0 = (undefined1 *)0x975e12;
    bVar13 = ScriptContext::EnsureInterpreterArena(this,(ArenaAllocator **)(auStack_e8 + 8));
    puStack_f0 = (undefined1 *)0x975e28;
    auStack_78 = (undefined1  [8])
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )auStack_e8._8_8_,(ulong)(uint)setup.inSlotsCount << 3);
    if (uVar24 == 0) {
      ppvVar26 = (Var *)0x0;
    }
    else {
      puStack_f0 = (undefined1 *)0x975e54;
      ThreadContext::ProbeStack(this->threadContext,uVar24 * 8 + 0x4000,this,unaff_retaddr);
      pEVar22 = (ExecutionInfoManager *)(auStack_e8 + -(uVar24 * 8 + 0xf & 0xfffffffffffffff0));
      ppvVar26 = (Var *)pEVar22;
    }
    pEVar25 = (ExecutionInfoManager *)auStack_78;
  }
  pEVar22[-1].m_innerloopLastLocation.m_line = 0x976075;
  pEVar22[-1].m_innerloopLastLocation.m_column = 0;
  pvVar20 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,LoopHeaderArray);
  if (pvVar20 == (void *)0x0) {
    loopHeaderArray = (LoopHeader *)0x0;
  }
  else {
    pEVar22[-1].m_innerloopLastLocation.m_line = 0x976082;
    pEVar22[-1].m_innerloopLastLocation.m_column = 0;
    loopHeaderArray = FunctionBody::GetLoopHeaderArrayPtr(this_01);
  }
  pEVar22[-1].m_innerloopLastLocation.m_loopTime = -0x101010101010102;
  pEVar22[-1].m_innerloopLastLocation.m_line = 0xfefefefe;
  this_02 = auStack_78;
  pEVar22[-1].m_innerloopLastLocation.m_column = 0xfefefefe;
  bVar2 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  pEVar22[-1].m_innerloopLastLocation.m_functionTime =
       (int64)&pEVar22[-1].m_innerloopLastLocation.m_loopTime;
  pEVar22[-1].m_innerloopLastLocation.m_eventTime = (int64)pEVar25;
  *(undefined8 *)&pEVar22[-1].m_unRestoredBreakpoints.field_0x28 = 0x9760d4;
  Setup::InitializeAllocation
            ((Setup *)&tmpAlloc,(Var *)this_02,ppvVar26,
             (bool)((bVar2 & 4) >> 2 & asmJsReturn == (AsmJsReturnStruct *)0x0),bVar12,
             loopHeaderArray,pEVar22[-1].m_innerloopLastLocation.m_eventTime,
             (Var)pEVar22[-1].m_innerloopLastLocation.m_functionTime);
  piVar23 = &pEVar22[-1].m_innerloopLastLocation.m_loopTime;
  pEVar22[-1].m_innerloopLastLocation.m_functionTime = 0x9760e5;
  ByteCodeReader::Create((ByteCodeReader *)this_02,this_01,0);
LAB_00976108:
  auStack_78 = (undefined1  [8])0x0;
  exceptionFramePopper.m_eimanager = (ExecutionInfoManager *)0x0;
  if (this->TTDShouldPerformRecordOrReplayDebuggerAction == true) {
    uVar4 = *(ushort *)
             ((long)&(((ExecutionInfoManager *)this_02)->m_lastExceptionLocation).
                     m_sourceScriptLogId + 4);
    pEVar22 = this_00->TTDExecutionInfo;
    uVar5 = *(uint *)&(args->super_Arguments).Info;
    ppvVar26 = (args->super_Arguments).Values;
    *(undefined8 *)((long)piVar23 + -8) = 0x976150;
    TTD::ExecutionInfoManager::PushCallEvent
              (pEVar22,(JavascriptFunction *)function,uVar5 & 0xffffff,ppvVar26,
               SUB41((uVar4 & 4) >> 2,0));
    auStack_78 = (undefined1  [8])this_00->TTDExecutionInfo;
    exceptionFramePopper.m_eimanager = (ExecutionInfoManager *)function;
  }
  setup.inParams = (Var *)this_02;
  if ((asmJsReturn == (AsmJsReturnStruct *)0x0) &&
     (pUVar6 = (this_01->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
     bVar2 = pUVar6->field_0xa8,
     (byte)((bVar2 & 0x40) >> 6 & (bVar2 >> 5 | (pUVar6->debugModeSource).ptr != (uchar *)0x0)) == 1
     )) {
    pTVar7 = *(ThreadContext **)
              (*(long *)&(((ExecutionInfoManager *)this_02)->m_lastReturnLocation).
                         m_isExceptionFrame + 0x3b8);
    setup.function._0_1_ = 0;
    (((ExecutionInfoManager *)this_02)->m_lastReturnLocation).m_lastFrame.LoopTime =
         (uint64)returnAddress;
    *(undefined8 *)
     &(((ExecutionInfoManager *)this_02)->m_lastReturnLocation).m_lastFrame.LastStatementIndex =
         setup._56_8_;
    tmpAlloc = (ArenaAllocator *)pTVar7;
    if (((((ExecutionInfoManager *)this_02)->m_lastReturnLocation).m_lastFrame.Name[0x23] & L'\x02')
        == L'\0') {
      *(undefined8 *)((long)piVar23 + -8) = 0x9761ee;
      ThreadContext::PushInterpreterFrame(pTVar7,(InterpreterStackFrame *)this_02);
    }
    else {
      setup.function._0_1_ = 1;
    }
    *(undefined8 *)((long)piVar23 + -8) = 0x976350;
    pvVar21 = DebugProcess((InterpreterStackFrame *)this_02);
  }
  else {
    pTVar7 = *(ThreadContext **)
              (*(long *)&(((ExecutionInfoManager *)this_02)->m_lastReturnLocation).
                         m_isExceptionFrame + 0x3b8);
    setup.function._0_1_ = 0;
    (((ExecutionInfoManager *)this_02)->m_lastReturnLocation).m_lastFrame.LoopTime =
         (uint64)returnAddress;
    *(undefined8 *)
     &(((ExecutionInfoManager *)this_02)->m_lastReturnLocation).m_lastFrame.LastStatementIndex =
         setup._56_8_;
    tmpAlloc = (ArenaAllocator *)pTVar7;
    if (((((ExecutionInfoManager *)this_02)->m_lastReturnLocation).m_lastFrame.Name[0x23] & L'\x02')
        == L'\0') {
      *(undefined8 *)((long)piVar23 + -8) = 0x976248;
      ThreadContext::PushInterpreterFrame(pTVar7,(InterpreterStackFrame *)this_02);
    }
    else {
      setup.function._0_1_ = 1;
    }
    *(undefined8 *)((long)piVar23 + -8) = 0x976259;
    pvVar21 = Process((InterpreterStackFrame *)this_02);
  }
  *(undefined8 *)((long)piVar23 + -8) = 0x976268;
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)&tmpAlloc);
  *(undefined8 *)((long)piVar23 + -8) = 0x976270;
  FunctionBody::EndExecution(this_01);
  if (this->TTDShouldPerformRecordOrReplayDebuggerAction == true) {
    auStack_78 = (undefined1  [8])0x0;
    pEVar22 = this_00->TTDExecutionInfo;
    *(undefined8 *)((long)piVar23 + -8) = 0x976299;
    TTD::ExecutionInfoManager::PopCallEvent(pEVar22,(JavascriptFunction *)function,pvVar21);
  }
  if (asmJsReturn != (AsmJsReturnStruct *)0x0) {
    asmJsReturn->i =
         *(int32 *)(((ExecutionInfoManager *)this_02)->m_pendingTTDBP).m_sourceScriptLogId;
    asmJsReturn->l = *(int64 *)(((ExecutionInfoManager *)this_02)->m_pendingTTDBP).m_bpId;
    asmJsReturn->d = *(double *)(((ExecutionInfoManager *)this_02)->m_pendingTTDBP).m_etime;
    asmJsReturn->f = *(float *)(((ExecutionInfoManager *)this_02)->m_pendingTTDBP).m_ftime;
    pTVar8 = *(Type **)&(((ExecutionInfoManager *)this_02)->m_pendingTTDBP).m_functionColumn;
    TVar11 = pTVar8[1];
    (asmJsReturn->simd).field_0.f64[0] = *pTVar8;
    (asmJsReturn->simd).field_0.f64[1] = TVar11;
  }
  if (bVar13 != false) {
    *(undefined8 *)((long)piVar23 + -8) = 0x9762fc;
    ScriptContext::ReleaseInterpreterArena(this);
  }
  if (bVar12) {
    flags = this_00->implicitCallFlags;
    *(undefined8 *)((long)piVar23 + -8) = 0x976316;
    DynamicProfileInfo::RecordImplicitCallFlags(local_88,flags);
  }
  *(undefined8 *)((long)piVar23 + -8) = 0x97631f;
  TTD::TTDExceptionFramePopper::~TTDExceptionFramePopper((TTDExceptionFramePopper *)auStack_78);
  this_00->loopDepth = uVar3;
  *piVar17 = *piVar17 + -1;
  return pvVar21;
}

Assistant:

Var InterpreterStackFrame::InterpreterHelper(ScriptFunction* function, ArgumentReader args, void* returnAddress, void* addressOfReturnAddress, AsmJsReturnStruct* asmJsReturn)
    {
        const bool isAsmJs = asmJsReturn != nullptr;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // Support for simulating partially initialized interpreter stack frame.
        InterpreterThunkStackCountTracker tracker;

        if (CONFIG_ISENABLED(InjectPartiallyInitializedInterpreterFrameErrorFlag) &&
            CONFIG_FLAG(InjectPartiallyInitializedInterpreterFrameError) == InterpreterThunkStackCountTracker::GetCount())
        {
            switch (CONFIG_FLAG(InjectPartiallyInitializedInterpreterFrameErrorType))
            {
            case 0:
                DebugBreak();
                break;
            case 1:
                Js::JavascriptError::MapAndThrowError(function->GetScriptContext(), VBSERR_InternalError);
                break;
            default:
                DebugBreak();
            }
        }
#endif
        ScriptContext* functionScriptContext = function->GetScriptContext();
        ThreadContext * threadContext = functionScriptContext->GetThreadContext();
        Assert(!threadContext->IsDisableImplicitException());
        functionScriptContext->VerifyAlive(!function->IsExternal());
        Assert(threadContext->IsScriptActive());
        Assert(threadContext->IsInScript());

        FunctionBody* executeFunction = function->GetFunctionBody();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (!isAsmJs && executeFunction->IsInDebugMode() != functionScriptContext->IsScriptContextInDebugMode()) // debug mode mismatch
        {
            if (executeFunction->GetUtf8SourceInfo()->GetIsLibraryCode())
            {
                Assert(!executeFunction->IsInDebugMode()); // Library script byteCode is never in debug mode
            }
            else
            {
                Throw::FatalInternalError();
            }
        }
#endif

        if (executeFunction->GetInterpretedCount() == 0)
        {
            executeFunction->TraceInterpreterExecutionMode();
        }


        class AutoRestore
        {
        private:
            ThreadContext * const threadContext;
            const uint8 savedLoopDepth;

        public:
            AutoRestore(ThreadContext *const threadContext, FunctionBody *const executeFunction)
                : threadContext(threadContext),
                savedLoopDepth(threadContext->LoopDepth())
            {
                if (savedLoopDepth != 0 && !executeFunction->GetIsAsmJsFunction())
                {
                    executeFunction->SetWasCalledFromLoop();
                }
            }

            ~AutoRestore()
            {
                threadContext->SetLoopDepth(savedLoopDepth);
            }
        } autoRestore(threadContext, executeFunction);

#if ENABLE_PROFILE_INFO
        DynamicProfileInfo * dynamicProfileInfo = nullptr;
        const bool doProfile = ShouldDoProfile(executeFunction);
        if (doProfile)
        {
#if !DYNAMIC_INTERPRETER_THUNK
            executeFunction->EnsureDynamicProfileInfo();
#endif
            dynamicProfileInfo = executeFunction->GetDynamicProfileInfo();
            threadContext->ClearImplicitCallFlags();
        }
#else
        const bool doProfile = false;
#endif

        executeFunction->IncreaseInterpretedCount();
#ifdef BGJIT_STATS
        functionScriptContext->interpretedCount++;
        functionScriptContext->maxFuncInterpret = max(functionScriptContext->maxFuncInterpret, executeFunction->GetInterpretedCount());
#endif

        AssertMsg(!executeFunction->IsDeferredParseFunction(),
            "Non-intrinsic functions must provide byte-code to execute");

        executeFunction->BeginExecution();

        bool fReleaseAlloc = false;
        InterpreterStackFrame* newInstance = nullptr;

        if (!isAsmJs && executeFunction->IsCoroutine())
        {
            // If the FunctionBody is a generator then this call is being made by one of the three
            // generator resuming methods: next(), throw(), or return().  They all pass the generator
            // object as the first of two arguments.  The real user arguments are obtained from the
            // generator object.  The second argument is the resume yield object which is only needed
            // when resuming a generator and so it is only used here if a frame already exists on the
            // generator object.
            AssertOrFailFastMsg(args.Info.Count == 2 && ((args.Info.Flags & CallFlags_ExtraArg) == CallFlags_None), "Generator ScriptFunctions should only be invoked by generator APIs with the pair of arguments they pass in -- the generator object and a resume yield object");

            JavascriptGenerator* generator = VarTo<JavascriptGenerator>(args[0]);
            newInstance = generator->GetFrame();

            if (newInstance != nullptr)
            {
                newInstance->SetNonVarReg(executeFunction->GetYieldRegister(), args[1]);

                // The debugger relies on comparing stack addresses of frames to decide when a step_out is complete so
                // give the InterpreterStackFrame a legit enough stack address to make this comparison work.
                newInstance->m_stackAddress = reinterpret_cast<DWORD_PTR>(&generator);

                newInstance->retOffset = 0;
            }
            else
            {
                newInstance = CreateInterpreterStackFrameForGenerator(function, executeFunction, generator, doProfile);
            }
        }
        else
        {
            InterpreterStackFrame::Setup setup(function, args);
            size_t varAllocCount = setup.GetAllocationVarCount();
            size_t stackVarAllocCount = setup.GetStackAllocationVarCount();
            size_t varSizeInBytes;

            //
            // Allocate a new InterpreterStackFrame instance on the interpreter's virtual stack.
            //
            DWORD_PTR stackAddr;

            Var* allocation;
            Var* stackAllocation = nullptr;

            // If the locals area exceeds a certain limit, allocate it from a private arena rather than
            // this frame. The current limit is based on an old assert on the number of locals we would allow here.
            if ((varAllocCount + stackVarAllocCount) > InterpreterStackFrame::LocalsThreshold)
            {
                ArenaAllocator *tmpAlloc = nullptr;
                fReleaseAlloc = functionScriptContext->EnsureInterpreterArena(&tmpAlloc);
                varSizeInBytes = varAllocCount * sizeof(Var);
                allocation = (Var*)tmpAlloc->Alloc(varSizeInBytes);
                stackAddr = reinterpret_cast<DWORD_PTR>(&allocation); // use a stack address so the debugger stepping logic works (step-out, for example, compares stack depths to determine when to complete the step)
                if (stackVarAllocCount != 0)
                {
                    size_t stackVarSizeInBytes = stackVarAllocCount * sizeof(Var);
                    PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + stackVarSizeInBytes);
                    stackAllocation = (Var*)_alloca(stackVarSizeInBytes);
                }
            }
            else
            {
                varSizeInBytes = (varAllocCount + stackVarAllocCount) * sizeof(Var);
                PROBE_STACK_PARTIAL_INITIALIZED_INTERPRETER_FRAME(functionScriptContext, Js::Constants::MinStackInterpreter + varSizeInBytes);
                allocation = (Var*)_alloca(varSizeInBytes);
#if DBG
                memset(allocation, 0xFE, varSizeInBytes);
#endif
                stackAddr = reinterpret_cast<DWORD_PTR>(allocation);
            }

            /*
            * If the function has any loop headers, we allocate an array for the loop headers wrappers, and
            * reference the wrappers in the array. We then push the pointer to the array onto the stack itself.
            * We do this so that while the function is being interpreted, we don't want the jitted loop
            * bodies to be collected, even if the loop body isn't being executed. The loop body will
            * get collected when the function has been JITted, and when the function exits the interpreter.
            * The array contains nulls if the loop body isn't jitted (or hasn't been jitted yet) but
            * it's cheaper to just copy them all into the recycler array rather than just the ones that
            * have been jitted.
            */
            LoopHeader* loopHeaderArray = nullptr;

            if (executeFunction->GetHasAllocatedLoopHeaders())
            {
                // Loop header array is recycler allocated, so we push it on the stack
                // When we scan the stack, we'll recognize it as a recycler allocated
                // object, and mark it's contents and keep the individual loop header
                // wrappers alive
                loopHeaderArray = executeFunction->GetLoopHeaderArrayPtr();
            }

#if DBG
            Js::RecyclableObject * invalidStackVar = (Js::RecyclableObject*)_alloca(sizeof(Js::RecyclableObject));
            memset(reinterpret_cast<void*>(invalidStackVar), 0xFE, sizeof(Js::RecyclableObject));
#endif

            newInstance = setup.InitializeAllocation(allocation, stackAllocation, executeFunction->GetHasImplicitArgIns() && !isAsmJs, doProfile, loopHeaderArray, stackAddr
#if DBG
                , invalidStackVar
#endif
                );

            newInstance->m_reader.Create(executeFunction);
        }
        //
        // Execute the function's byte-code, returning the return-value:
        // - Mark that the function is current executing and may not be modified.
        //

#if ENABLE_TTD
        TTD::TTDExceptionFramePopper exceptionFramePopper;
        if (SHOULD_DO_TTD_STACK_STMT_OP(functionScriptContext))
        {
            bool isInFinally = newInstance->TestFlags(Js::InterpreterStackFrameFlags_WithinFinallyBlock);

            threadContext->TTDExecutionInfo->PushCallEvent(function, args.Info.Count, args.Values, isInFinally);
            exceptionFramePopper.PushInfo(threadContext->TTDExecutionInfo, function);
        }
#endif

        Var aReturn = nullptr;

        {
#ifdef ENABLE_SCRIPT_DEBUGGING
            if (!isAsmJs && executeFunction->IsInDebugMode())
            {
#if DYNAMIC_INTERPRETER_THUNK
                PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, addressOfReturnAddress);
                aReturn = newInstance->DebugProcess();
#else
                aReturn = newInstance->DebugProcessThunk(_ReturnAddress(), _AddressOfReturnAddress());
#endif
            }
            else
#endif
            {
#if DYNAMIC_INTERPRETER_THUNK
                PushPopFrameHelper pushPopFrameHelper(newInstance, returnAddress, addressOfReturnAddress);
                aReturn = newInstance->Process();
#else
                aReturn = newInstance->ProcessThunk(_ReturnAddress(), _AddressOfReturnAddress());
#endif
            }
        }

        executeFunction->EndExecution();

#if ENABLE_TTD
        if (SHOULD_DO_TTD_STACK_STMT_OP(functionScriptContext))
        {
            exceptionFramePopper.PopInfo();
            threadContext->TTDExecutionInfo->PopCallEvent(function, aReturn);
        }
#endif

#ifdef ASMJS_PLAT
        if (isAsmJs)
        {
            asmJsReturn->i = newInstance->GetRegRawInt(0);
            asmJsReturn->l = newInstance->GetRegRawInt64(0);
            asmJsReturn->d = newInstance->GetRegRawDouble(0);
            asmJsReturn->f = newInstance->GetRegRawFloat(0);
            asmJsReturn->simd = newInstance->GetRegRawSimd(0);
        }
#endif

        if (fReleaseAlloc)
        {
            functionScriptContext->ReleaseInterpreterArena();
        }

#if ENABLE_PROFILE_INFO
        if (doProfile)
        {
            dynamicProfileInfo->RecordImplicitCallFlags(threadContext->GetImplicitCallFlags());
        }
#endif

        return aReturn;
    }